

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_find(HSQUIRRELVM v)

{
  SQArray *this;
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *o2;
  SQObjectPtr local_78 [2];
  bool local_51;
  long lStack_50;
  bool res;
  SQInteger n;
  SQObjectPtr temp;
  SQInteger size;
  SQArray *a;
  SQObjectPtr *val;
  SQObject *o;
  HSQUIRRELVM v_local;
  
  pSVar2 = stack_get(v,1);
  o2 = stack_get(v,2);
  this = (pSVar2->super_SQObject)._unVal.pArray;
  temp.super_SQObject._unVal.nInteger = SQArray::Size(this);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)&n);
  lStack_50 = 0;
  do {
    if (temp.super_SQObject._unVal.nInteger <= lStack_50) {
      v_local = (HSQUIRRELVM)0x0;
LAB_0011e7ae:
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&n);
      return (SQInteger)v_local;
    }
    local_51 = false;
    SQArray::Get(this,lStack_50,(SQObjectPtr *)&n);
    bVar1 = SQVM::IsEqual((SQObjectPtr *)&n,o2,&local_51);
    if ((bVar1) && ((local_51 & 1U) != 0)) {
      SQObjectPtr::SQObjectPtr(local_78,lStack_50);
      SQVM::Push(v,local_78);
      SQObjectPtr::~SQObjectPtr(local_78);
      v_local = (HSQUIRRELVM)0x1;
      goto LAB_0011e7ae;
    }
    lStack_50 = lStack_50 + 1;
  } while( true );
}

Assistant:

static SQInteger array_find(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQObjectPtr &val = stack_get(v,2);
    SQArray *a = _array(o);
    SQInteger size = a->Size();
    SQObjectPtr temp;
    for(SQInteger n = 0; n < size; n++) {
        bool res = false;
        a->Get(n,temp);
        if(SQVM::IsEqual(temp,val,res) && res) {
            v->Push(n);
            return 1;
        }
    }
    return 0;
}